

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SegmentBase.hpp
# Opt level: O0

void __thiscall cppjieba::SegmentBase::SegmentBase(SegmentBase *this)

{
  bool bVar1;
  ostream *poVar2;
  undefined8 *in_RDI;
  string *in_stack_00000340;
  SegmentBase *in_stack_00000348;
  Logger *in_stack_fffffffffffffe50;
  int in_stack_fffffffffffffeac;
  char *in_stack_fffffffffffffeb0;
  size_t in_stack_fffffffffffffeb8;
  Logger *in_stack_fffffffffffffec0;
  allocator local_29;
  string local_28 [40];
  
  *in_RDI = &PTR__SegmentBase_00186c50;
  std::
  unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
  ::unordered_set((unordered_set<unsigned_int,_std::hash<unsigned_int>,_std::equal_to<unsigned_int>,_std::allocator<unsigned_int>_>
                   *)0x160a18);
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_28,anon_var_dwarf_1e1de,&local_29);
  bVar1 = ResetSeparators(in_stack_00000348,in_stack_00000340);
  std::__cxx11::string::~string(local_28);
  std::allocator<char>::~allocator((allocator<char> *)&local_29);
  if (((bVar1 ^ 0xffU) & 1) != 0) {
    limonp::Logger::Logger
              (in_stack_fffffffffffffec0,in_stack_fffffffffffffeb8,in_stack_fffffffffffffeb0,
               in_stack_fffffffffffffeac);
    poVar2 = limonp::Logger::Stream((Logger *)&stack0xfffffffffffffe40);
    poVar2 = std::operator<<(poVar2,"exp: [ResetSeparators(SPECIAL_SEPARATORS)");
    std::operator<<(poVar2,"] false. ");
    limonp::Logger::~Logger(in_stack_fffffffffffffe50);
  }
  return;
}

Assistant:

SegmentBase() {
    XCHECK(ResetSeparators(SPECIAL_SEPARATORS));
  }